

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

pair<bool,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>
 __thiscall
nlohmann::detail::
json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
::handle_value<std::__cxx11::string&>
          (json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,
          bool skip_callback)

{
  uint uVar1;
  char *pcVar2;
  value_t *pvVar3;
  value_t vVar4;
  json_value jVar5;
  char cVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar10;
  pair<bool,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>
  pVar11;
  undefined1 local_59;
  undefined1 local_58 [8];
  json_value local_50;
  undefined4 local_44;
  value_t local_40;
  undefined8 local_38;
  value_t local_30;
  undefined8 local_28;
  
  uVar9 = (ulong)*(uint *)(this + 0x38) - 1;
  uVar7 = (ulong)*(uint *)(this + 0x38) + 0x3e;
  if (-1 < (long)uVar9) {
    uVar7 = uVar9;
  }
  if ((*(ulong *)(((long)uVar7 >> 6) * 8 + *(long *)(this + 0x30) + -8 +
                 (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) * 8) >> (uVar9 & 0x3f) &
      1) == 0) {
    uVar9 = 0;
    pbVar10 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)0x0;
    goto LAB_0014222e;
  }
  local_58[0] = string;
  local_50.object =
       (object_t *)
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,std::__cxx11::string_const&>(v);
  if (skip_callback) {
LAB_001420ed:
    jVar5 = local_50;
    vVar4 = local_58[0];
    if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
      local_58[0] = null;
      local_50.object = (object_t *)0x0;
      pvVar3 = *(value_t **)this;
      local_30 = *pvVar3;
      *pvVar3 = vVar4;
      local_28 = *(undefined8 *)(pvVar3 + 8);
      ((json_value *)(pvVar3 + 8))->object = (object_t *)jVar5;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_28,local_30);
      pbVar10 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  **)this;
    }
    else {
      pcVar2 = *(char **)(*(long *)(this + 0x10) + -8);
      if (pcVar2 == (char *)0x0) goto LAB_0014221b;
      if (*pcVar2 == '\x02') {
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  (*(vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                     **)(pcVar2 + 8),
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_58);
        pbVar10 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(*(long *)(*(long *)(*(long *)(*(long *)(this + 0x10) + -8) + 8) + 8) + -0x10);
      }
      else {
        uVar1 = *(uint *)(this + 0x60);
        uVar9 = (ulong)uVar1 - 1;
        uVar7 = (ulong)uVar1 + 0x3e;
        if (-1 < (long)uVar9) {
          uVar7 = uVar9;
        }
        uVar7 = *(ulong *)(*(long *)(this + 0x58) + ((long)uVar7 >> 6) * 8 + -8 +
                          (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) * 8);
        *(uint *)(this + 0x60) = uVar1 - 1;
        if (uVar1 == 0) {
          *(undefined4 *)(this + 0x60) = 0x3f;
          *(long *)(this + 0x58) = *(long *)(this + 0x58) + -8;
        }
        if ((1L << ((byte)uVar9 & 0x3f) & uVar7) == 0) goto LAB_0014221b;
        local_58[0] = null;
        local_50.object = (object_t *)0x0;
        pvVar3 = *(value_t **)(this + 0x70);
        local_40 = *pvVar3;
        *pvVar3 = vVar4;
        local_38 = *(undefined8 *)(pvVar3 + 8);
        ((json_value *)(pvVar3 + 8))->object = (object_t *)jVar5;
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_38,local_40);
        pbVar10 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    **)(this + 0x70);
      }
    }
    uVar9 = CONCAT71((int7)((ulong)this >> 8),1);
  }
  else {
    local_44 = (undefined4)((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) >> 3);
    local_59 = 5;
    if (*(long *)(this + 0x90) == 0) {
      uVar8 = std::__throw_bad_function_call();
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_58 + 8),local_58[0]);
      _Unwind_Resume(uVar8);
    }
    cVar6 = (**(code **)(this + 0x98))(this + 0x80,&local_44,&local_59,local_58);
    if (cVar6 != '\0') goto LAB_001420ed;
LAB_0014221b:
    uVar9 = 0;
    pbVar10 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)0x0;
  }
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_58 + 8),local_58[0]);
LAB_0014222e:
  pVar11._0_8_ = uVar9 & 0xffffffff;
  pVar11.second = pbVar10;
  return pVar11;
}

Assistant:

std::pair<bool, BasicJsonType*> handle_value(Value&& v, const bool skip_callback = false)
    {
        assert(not keep_stack.empty());

        // do not handle this value if we know it would be added to a discarded
        // container
        if (not keep_stack.back())
        {
            return {false, nullptr};
        }

        // create value
        auto value = BasicJsonType(std::forward<Value>(v));

        // check callback
        const bool keep = skip_callback or callback(static_cast<int>(ref_stack.size()), parse_event_t::value, value);

        // do not handle this value if we just learnt it shall be discarded
        if (not keep)
        {
            return {false, nullptr};
        }

        if (ref_stack.empty())
        {
            root = std::move(value);
            return {true, &root};
        }
        else
        {
            // skip this value if we already decided to skip the parent
            // (https://github.com/nlohmann/json/issues/971#issuecomment-413678360)
            if (not ref_stack.back())
            {
                return {false, nullptr};
            }

            assert(ref_stack.back()->is_array() or ref_stack.back()->is_object());
            if (ref_stack.back()->is_array())
            {
                ref_stack.back()->m_value.array->push_back(std::move(value));
                return {true, &(ref_stack.back()->m_value.array->back())};
            }
            else
            {
                // check if we should store an element for the current key
                assert(not key_keep_stack.empty());
                const bool store_element = key_keep_stack.back();
                key_keep_stack.pop_back();

                if (not store_element)
                {
                    return {false, nullptr};
                }

                assert(object_element);
                *object_element = std::move(value);
                return {true, object_element};
            }
        }
    }